

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

unique_ptr<psy::C::Compilation,_std::default_delete<psy::C::Compilation>_>
psy::C::Compilation::create(string *id,PlatformOptions platformOpts,InferenceOptions inferOpts)

{
  Compilation *this;
  unique_ptr<psy::C::Compilation::CompilationImpl,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
  *puVar1;
  pointer pCVar2;
  anon_union_4_2_c94a1d5b_for_InferenceOptions_0 in_EDX;
  undefined4 in_register_00000034;
  string *id_local;
  InferenceOptions inferOpts_local;
  unique_ptr<psy::C::Compilation,_std::default_delete<psy::C::Compilation>_> *compilation;
  
  this = (Compilation *)operator_new(8);
  Compilation(this);
  std::unique_ptr<psy::C::Compilation,std::default_delete<psy::C::Compilation>>::
  unique_ptr<std::default_delete<psy::C::Compilation>,void>
            ((unique_ptr<psy::C::Compilation,std::default_delete<psy::C::Compilation>> *)id,this);
  puVar1 = &std::unique_ptr<psy::C::Compilation,_std::default_delete<psy::C::Compilation>_>::
            operator->((unique_ptr<psy::C::Compilation,_std::default_delete<psy::C::Compilation>_> *
                       )id)->impl_;
  pCVar2 = std::
           unique_ptr<psy::C::Compilation::CompilationImpl,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
           ::operator->(puVar1);
  std::__cxx11::string::operator=
            ((string *)&pCVar2->id_,(string *)CONCAT44(in_register_00000034,inferOpts.field_0));
  puVar1 = &std::unique_ptr<psy::C::Compilation,_std::default_delete<psy::C::Compilation>_>::
            operator->((unique_ptr<psy::C::Compilation,_std::default_delete<psy::C::Compilation>_> *
                       )id)->impl_;
  pCVar2 = std::
           unique_ptr<psy::C::Compilation::CompilationImpl,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
           ::operator->(puVar1);
  memcpy(&pCVar2->platformOpts_,&platformOpts,0x60);
  puVar1 = &std::unique_ptr<psy::C::Compilation,_std::default_delete<psy::C::Compilation>_>::
            operator->((unique_ptr<psy::C::Compilation,_std::default_delete<psy::C::Compilation>_> *
                       )id)->impl_;
  pCVar2 = std::
           unique_ptr<psy::C::Compilation::CompilationImpl,_std::default_delete<psy::C::Compilation::CompilationImpl>_>
           ::operator->(puVar1);
  (pCVar2->inferOpts_).field_0 = in_EDX;
  return (__uniq_ptr_data<psy::C::Compilation,_std::default_delete<psy::C::Compilation>,_true,_true>
         )(__uniq_ptr_data<psy::C::Compilation,_std::default_delete<psy::C::Compilation>,_true,_true>
           )id;
}

Assistant:

std::unique_ptr<Compilation> Compilation::create(
        const std::string& id,
        PlatformOptions platformOpts,
        InferenceOptions inferOpts)
{
    std::unique_ptr<Compilation> compilation(new Compilation);
    compilation->P->id_ = id;
    compilation->P->platformOpts_ = platformOpts;
    compilation->P->inferOpts_ = inferOpts;
    return compilation;
}